

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall cfd::ConfidentialTransactionContext::Verify(ConfidentialTransactionContext *this)

{
  bool bVar1;
  reference this_00;
  long in_RDI;
  OutPoint outpoint;
  ConfidentialTxIn *vin;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range1;
  OutPoint *in_stack_00000528;
  ConfidentialTransactionContext *in_stack_00000530;
  OutPoint *in_stack_ffffffffffffffa8;
  vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *in_stack_ffffffffffffffb0;
  ConfidentialTransactionContext *in_stack_ffffffffffffffb8;
  __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_20;
  __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
  local_18;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *local_10;
  
  local_10 = (vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
             (in_RDI + 0x10);
  local_18._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::begin
                 (local_10);
  local_20._M_current =
       (ConfidentialTxIn *)
       std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::end
                 (local_10);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
              ::operator*(&local_18);
    core::AbstractTxIn::GetOutPoint
              ((OutPoint *)&stack0xffffffffffffffb0,&this_00->super_AbstractTxIn);
    bVar1 = IsFindOutPoint(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8);
    if (!bVar1) {
      Verify(in_stack_00000530,in_stack_00000528);
    }
    core::OutPoint::~OutPoint((OutPoint *)0x5556b3);
    __gnu_cxx::
    __normal_iterator<cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void ConfidentialTransactionContext::Verify() {
  for (const auto& vin : vin_) {
    OutPoint outpoint = vin.GetOutPoint();
    if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
      Verify(outpoint);
    }
  }
}